

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O0

char * CBS_asn1_oid_to_text(CBS *cbs)

{
  int iVar1;
  size_t sVar2;
  size_t local_70;
  size_t txt_len;
  uint8_t *txt;
  uint64_t v;
  CBB cbb;
  CBS copy;
  CBS *cbs_local;
  
  cbb.u._24_8_ = cbs->data;
  iVar1 = CBB_init((CBB *)&v,0x20);
  if ((iVar1 != 0) &&
     (iVar1 = parse_base128_integer((CBS *)((long)&cbb.u + 0x18),(uint64_t *)&txt), iVar1 != 0)) {
    if (txt < (uint8_t *)0x50) {
      iVar1 = add_decimal((CBB *)&v,(ulong)txt / 0x28);
      if ((iVar1 == 0) || (iVar1 = CBB_add_u8((CBB *)&v,'.'), iVar1 == 0)) goto LAB_003b43c2;
      iVar1 = add_decimal((CBB *)&v,(ulong)txt % 0x28);
    }
    else {
      iVar1 = CBB_add_bytes((CBB *)&v,(uint8_t *)"2.",2);
      if (iVar1 == 0) goto LAB_003b43c2;
      iVar1 = add_decimal((CBB *)&v,(uint64_t)(txt + -0x50));
    }
    if (iVar1 != 0) {
      while (sVar2 = CBS_len((CBS *)((long)&cbb.u + 0x18)), sVar2 != 0) {
        iVar1 = parse_base128_integer((CBS *)((long)&cbb.u + 0x18),(uint64_t *)&txt);
        if (((iVar1 == 0) || (iVar1 = CBB_add_u8((CBB *)&v,'.'), iVar1 == 0)) ||
           (iVar1 = add_decimal((CBB *)&v,(uint64_t)txt), iVar1 == 0)) goto LAB_003b43c2;
      }
      iVar1 = CBB_add_u8((CBB *)&v,'\0');
      if ((iVar1 != 0) && (iVar1 = CBB_finish((CBB *)&v,(uint8_t **)&txt_len,&local_70), iVar1 != 0)
         ) {
        return (char *)txt_len;
      }
    }
  }
LAB_003b43c2:
  CBB_cleanup((CBB *)&v);
  return (char *)0x0;
}

Assistant:

char *CBS_asn1_oid_to_text(const CBS *cbs) {
  CBS copy = *cbs;
  CBB cbb;
  if (!CBB_init(&cbb, 32)) {
    goto err;
  }

  // The first component is 40 * value1 + value2, where value1 is 0, 1, or 2.
  uint64_t v;
  if (!parse_base128_integer(&copy, &v)) {
    goto err;
  }

  if (v >= 80) {
    if (!CBB_add_bytes(&cbb, (const uint8_t *)"2.", 2) ||
        !add_decimal(&cbb, v - 80)) {
      goto err;
    }
  } else if (!add_decimal(&cbb, v / 40) || !CBB_add_u8(&cbb, '.') ||
             !add_decimal(&cbb, v % 40)) {
    goto err;
  }

  while (CBS_len(&copy) != 0) {
    if (!parse_base128_integer(&copy, &v) || !CBB_add_u8(&cbb, '.') ||
        !add_decimal(&cbb, v)) {
      goto err;
    }
  }

  uint8_t *txt;
  size_t txt_len;
  if (!CBB_add_u8(&cbb, '\0') || !CBB_finish(&cbb, &txt, &txt_len)) {
    goto err;
  }

  return (char *)txt;

err:
  CBB_cleanup(&cbb);
  return NULL;
}